

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void string_suite::test_escape_tab(void)

{
  undefined4 local_188;
  value local_184 [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined4 local_14c;
  value local_148 [2];
  undefined1 local_140 [8];
  decoder_type decoder;
  char input [5];
  
  decoder.current.scan._260_1_ = 0;
  decoder.current.scan._256_4_ = 0x22745c22;
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<5ul>
            ((basic_decoder<char> *)local_140,
             (value_type (*) [5])((long)&decoder.current.scan + 0x100));
  local_148[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_14c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x65a,"void string_suite::test_escape_tab()",local_148,&local_14c);
  trial::protocol::json::detail::basic_decoder<char>::string_value<std::__cxx11::string>
            (&local_170,(basic_decoder<char> *)local_140);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("decoder.string_value<std::string>()","\"\\t\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x65b,"void string_suite::test_escape_tab()",&local_170,"\t");
  std::__cxx11::string::~string((string *)&local_170);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_140);
  local_184[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_140);
  local_188 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x65d,"void string_suite::test_escape_tab()",local_184,&local_188);
  return;
}

Assistant:

void test_escape_tab()
{
    const char input[] = "\"\\t\"";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.string_value<std::string>(), "\t");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}